

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TestSpecParser::addPattern<Catch::TestSpec::NamePattern>(TestSpecParser *this)

{
  _func_int **pp_Var1;
  string *this_00;
  int iVar2;
  undefined8 *puVar3;
  pointer puVar4;
  NamePattern *this_01;
  Pattern *p;
  pointer puVar5;
  ulong uVar6;
  pointer pcVar7;
  bool bVar8;
  Ptr<Catch::TestSpec::Pattern> pattern;
  string token;
  NonCopyable local_b0;
  ulong local_a8;
  undefined1 local_a0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_60 [16];
  pointer *local_50;
  long local_48;
  pointer local_40 [2];
  
  std::__cxx11::string::substr((ulong)(local_a0 + 0x30),(ulong)&this->m_arg);
  puVar4 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar5 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar4) {
    this_00 = (string *)(local_a0 + 0x30);
    uVar6 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)this_00);
      std::__cxx11::string::substr((ulong)(local_a0 + 0x10),(ulong)this_00);
      pcVar7 = (pointer)0xf;
      if (local_50 != local_40) {
        pcVar7 = local_40[0];
      }
      if (pcVar7 < (pointer)(local_a0._24_8_ + local_48)) {
        pcVar7 = (pointer)0xf;
        if ((undefined1 *)local_a0._16_8_ != local_a0 + 0x20) {
          pcVar7 = (pointer)local_a0._32_8_;
        }
        if (pcVar7 < (pointer)(local_a0._24_8_ + local_48)) goto LAB_0012670a;
        puVar3 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)(local_a0 + 0x10),0,(char *)0x0,(ulong)local_50);
      }
      else {
LAB_0012670a:
        puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,local_a0._16_8_);
      }
      pp_Var1 = (_func_int **)(puVar3 + 2);
      if ((_func_int **)*puVar3 == pp_Var1) {
        local_a0._0_8_ = *pp_Var1;
        local_a0._8_8_ = puVar3[3];
        local_b0._vptr_NonCopyable = (_func_int **)local_a0;
      }
      else {
        local_a0._0_8_ = *pp_Var1;
        local_b0._vptr_NonCopyable = (_func_int **)*puVar3;
      }
      local_a8 = puVar3[1];
      *puVar3 = pp_Var1;
      puVar3[1] = 0;
      *(undefined1 *)pp_Var1 = 0;
      std::__cxx11::string::operator=(this_00,(string *)&local_b0);
      if (local_b0._vptr_NonCopyable != (_func_int **)local_a0) {
        operator_delete(local_b0._vptr_NonCopyable);
      }
      if ((undefined1 *)local_a0._16_8_ != local_a0 + 0x20) {
        operator_delete((void *)local_a0._16_8_);
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      uVar6 = uVar6 + 1;
      puVar4 = (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (uVar6 < (ulong)((long)puVar5 - (long)puVar4 >> 3));
  }
  if (puVar5 != puVar4) {
    (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  local_b0._vptr_NonCopyable = (_func_int **)local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"exclude:","");
  if ((ulong)local_70._8_8_ < local_a8) {
    bVar8 = false;
  }
  else if (local_a8 == 0) {
    bVar8 = true;
  }
  else {
    iVar2 = bcmp(local_b0._vptr_NonCopyable,(void *)local_70._M_allocated_capacity,local_a8);
    bVar8 = iVar2 == 0;
  }
  if ((NamePattern *)local_b0._vptr_NonCopyable != (NamePattern *)local_a0) {
    operator_delete(local_b0._vptr_NonCopyable);
  }
  if (bVar8) {
    this->m_exclusion = true;
    std::__cxx11::string::substr((ulong)&local_b0,(ulong)(local_a0 + 0x30));
    std::__cxx11::string::operator=((string *)(local_a0 + 0x30),(string *)&local_b0);
    if ((NamePattern *)local_b0._vptr_NonCopyable != (NamePattern *)local_a0) {
      operator_delete(local_b0._vptr_NonCopyable);
    }
  }
  if (local_70._8_8_ != 0) {
    this_01 = (NamePattern *)operator_new(0x40);
    TestSpec::NamePattern::NamePattern(this_01,(string *)(local_a0 + 0x30));
    local_b0._vptr_NonCopyable = (_func_int **)this_01;
    (*(this_01->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable.
      _vptr_NonCopyable[2])(this_01);
    if (this->m_exclusion == true) {
      p = (Pattern *)operator_new(0x18);
      (p->super_SharedImpl<Catch::IShared>).m_rc = 0;
      (p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
           (_func_int **)&PTR__ExcludedPattern_00162840;
      p[1].super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
           local_b0._vptr_NonCopyable;
      if ((NamePattern *)local_b0._vptr_NonCopyable != (NamePattern *)0x0) {
        (**(code **)(*local_b0._vptr_NonCopyable + 0x10))();
      }
      Ptr<Catch::TestSpec::Pattern>::operator=((Ptr<Catch::TestSpec::Pattern> *)&local_b0,p);
    }
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,(value_type *)&local_b0);
    if ((NamePattern *)local_b0._vptr_NonCopyable != (NamePattern *)0x0) {
      (**(code **)(*local_b0._vptr_NonCopyable + 0x18))();
    }
  }
  this->m_exclusion = false;
  this->m_mode = None;
  if ((undefined1 *)local_70._M_allocated_capacity != local_60) {
    operator_delete((void *)local_70._M_allocated_capacity);
  }
  return;
}

Assistant:

void addPattern() {
            std::string token = subString();
            for( size_t i = 0; i < m_escapeChars.size(); ++i )
                token = token.substr( 0, m_escapeChars[i]-m_start-i ) + token.substr( m_escapeChars[i]-m_start-i+1 );
            m_escapeChars.clear();
            if( startsWith( token, "exclude:" ) ) {
                m_exclusion = true;
                token = token.substr( 8 );
            }
            if( !token.empty() ) {
                Ptr<TestSpec::Pattern> pattern = new T( token );
                if( m_exclusion )
                    pattern = new TestSpec::ExcludedPattern( pattern );
                m_currentFilter.m_patterns.push_back( pattern );
            }
            m_exclusion = false;
            m_mode = None;
        }